

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O2

void __thiscall
glslang::TParseContextBase::outputMessage
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,TPrefixType prefix,__va_list_tag *args)

{
  int *piVar1;
  EShMessages EVar2;
  TInfoSink *this_00;
  char acStack_4f8 [1224];
  
  vsnprintf(acStack_4f8,0x4c8,szExtraInfoFormat,args);
  TInfoSinkBase::prefix(&((this->super_TParseVersions).infoSink)->info,prefix);
  EVar2 = (this->super_TParseVersions).messages;
  TInfoSinkBase::location
            (&((this->super_TParseVersions).infoSink)->info,loc,(bool)((byte)(EVar2 >> 0x10) & 1),
             (bool)((byte)(EVar2 >> 0x11) & 1));
  this_00 = (this->super_TParseVersions).infoSink;
  TInfoSinkBase::append(&this_00->info,"\'");
  TInfoSinkBase::append(&this_00->info,szToken);
  TInfoSinkBase::append(&this_00->info,"\' : ");
  TInfoSinkBase::append(&this_00->info,szReason);
  TInfoSinkBase::append(&this_00->info," ");
  TInfoSinkBase::append(&this_00->info,acStack_4f8);
  TInfoSinkBase::append(&this_00->info,"\n");
  if (prefix == EPrefixError) {
    piVar1 = &(this->super_TParseVersions).numErrors;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void TParseContextBase::outputMessage(const TSourceLoc& loc, const char* szReason,
                                      const char* szToken,
                                      const char* szExtraInfoFormat,
                                      TPrefixType prefix, va_list args)
{
    const int maxSize = MaxTokenLength + 200;
    char szExtraInfo[maxSize];

    safe_vsprintf(szExtraInfo, maxSize, szExtraInfoFormat, args);

    infoSink.info.prefix(prefix);
    infoSink.info.location(loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
    infoSink.info << "'" << szToken <<  "' : " << szReason << " " << szExtraInfo << "\n";

    if (prefix == EPrefixError) {
        ++numErrors;
    }
}